

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RuntimeFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapTrueFunction(JavascriptLibrary *this)

{
  DynamicObject *prototype;
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  ScriptConfiguration *this_00;
  undefined4 *puVar4;
  RuntimeFunction **ppRVar5;
  Recycler *pRVar6;
  FunctionInfo *pFVar7;
  ScriptContext **ppSVar8;
  DynamicObject **ppDVar9;
  DynamicTypeHandler *typeHandler;
  RuntimeFunction *this_01;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_89;
  TrackAllocData local_88;
  DynamicType *local_60;
  DynamicType *type;
  undefined8 local_50;
  TrackAllocData local_48;
  FunctionInfo *local_20;
  FunctionInfo *functionInfo;
  JavascriptMethod entryPoint;
  JavascriptLibrary *this_local;
  
  entryPoint = (JavascriptMethod)this;
  pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                     (&(this->super_JavascriptLibraryBase).scriptContext);
  this_00 = ScriptContext::GetConfig(pSVar3);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x195c,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->asyncFromSyncIteratorValueUnwrapTrueFunction);
  if (*ppRVar5 == (RuntimeFunction *)0x0) {
    functionInfo = (FunctionInfo *)
                   JavascriptAsyncFromSyncIterator::
                   EntryAsyncFromSyncIteratorValueUnwrapTrueFunction;
    pRVar6 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1960);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_48);
    type = (DynamicType *)Memory::Recycler::AllocInlined;
    local_50 = 0;
    pFVar7 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar6,0x43c4b0);
    FunctionInfo::FunctionInfo
              (pFVar7,(JavascriptMethod)functionInfo,None,0xffffffff,(FunctionProxy *)0x0);
    local_20 = pFVar7;
    ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar3 = *ppSVar8;
    ppDVar9 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
    pFVar7 = functionInfo;
    prototype = *ppDVar9;
    typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
    local_60 = DynamicType::New(pSVar3,TypeIds_Function,&prototype->super_RecyclableObject,
                                (JavascriptMethod)pFVar7,typeHandler,false,false);
    pRVar6 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&RuntimeFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1963);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_88);
    this_01 = (RuntimeFunction *)new<(Memory::ObjectInfoBits)1>(0x40,pRVar6,&local_89);
    RuntimeFunction::RuntimeFunction(this_01,local_60,local_20);
    Memory::WriteBarrierPtr<Js::RuntimeFunction>::operator=
              (&this->asyncFromSyncIteratorValueUnwrapTrueFunction,this_01);
  }
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->asyncFromSyncIteratorValueUnwrapTrueFunction);
  return *ppRVar5;
}

Assistant:

RuntimeFunction* JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapTrueFunction()
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());
        if (asyncFromSyncIteratorValueUnwrapTrueFunction == nullptr)
        {
            JavascriptMethod entryPoint = JavascriptAsyncFromSyncIterator::EntryAsyncFromSyncIteratorValueUnwrapTrueFunction;
            FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint);
            DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());

            asyncFromSyncIteratorValueUnwrapTrueFunction = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo);
        }

        return asyncFromSyncIteratorValueUnwrapTrueFunction;
    }